

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Node * __thiscall JSON::Parser::parseArrayExpression(Node *__return_storage_ptr__,Parser *this)

{
  int start;
  TokenType TVar1;
  bool bVar2;
  vector<JSON::Node,_std::allocator<JSON::Node>_> elements;
  vector<JSON::Node,_std::allocator<JSON::Node>_> local_c8;
  string local_b0;
  Node local_90;
  
  start = (this->currentToken).start;
  expect(this,BRACKETS_START);
  next(this);
  elements.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  elements.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  elements.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar2 = false;
  while ((this->pos < this->length && ((this->currentToken).type != BRACKETS_END))) {
    parseNode(&local_90,this);
    std::vector<JSON::Node,_std::allocator<JSON::Node>_>::emplace_back<JSON::Node>
              (&elements,&local_90);
    Node::~Node(&local_90);
    TVar1 = (this->currentToken).type;
    bVar2 = false;
    if (TVar1 != BRACKETS_END) {
      if (TVar1 != COMMA) goto LAB_001041f6;
      bVar2 = true;
      next(this);
    }
  }
  if (bVar2) {
    unexpected(this,&this->lastToken);
  }
LAB_001041f6:
  expect(this,BRACKETS_END);
  std::__cxx11::string::string((string *)&local_b0,(string *)NodeType::ArrayExpression_abi_cxx11_);
  std::vector<JSON::Node,_std::allocator<JSON::Node>_>::vector(&local_c8,&elements);
  Node::Node(__return_storage_ptr__,&local_b0,&local_c8,start,(this->currentToken).end);
  std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&local_c8);
  std::__cxx11::string::~string((string *)&local_b0);
  next(this);
  std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&elements);
  return __return_storage_ptr__;
}

Assistant:

Node Parser::parseArrayExpression() {
        bool hasTailComma = false;
        int startPos = currentToken.start;
        expect(BRACKETS_START);
        next();
        vector<Node> elements;

        while (isValidPos() && currentToken.type != BRACKETS_END) {
            hasTailComma = false;
            elements.push_back(parseNode());

            // end of element
            if (currentToken.type == COMMA) {
                hasTailComma = true;
                next();
            } else if (currentToken.type != BRACKETS_END) {
                break;
            }
        }

        if (hasTailComma) {
            unexpected(lastToken);
        }

        expect(BRACKETS_END);
        Node node(NodeType::ArrayExpression, elements, startPos, currentToken.end);
        next();

        return node;
    }